

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

void AddSpecialSearchParams(Args *args,SearchParams<DNA> *sp)

{
  pointer pbVar1;
  int iVar2;
  Strand SVar3;
  mapped_type *this;
  key_type local_68;
  size_type *local_48;
  string str;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"--strand","");
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
         ::at(args,&local_68);
  docopt::value::throwIfNotKind(this,String);
  pbVar1 = (this->variant).strList.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48 = &str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pbVar1,
             (long)&(((this->variant).strList.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p + (long)pbVar1)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  sp->strand = Plus;
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar2 == 0) {
    SVar3 = Minus;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_48);
    if (iVar2 != 0) goto LAB_0013e766;
    SVar3 = Both;
  }
  sp->strand = SVar3;
LAB_0013e766:
  if (local_48 != &str._M_string_length) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void AddSpecialSearchParams( const Args& args, SearchParams< DNA >* sp ) {
  auto str = args.at( "--strand" ).asString();
  sp->strand = DNA::Strand::Plus;
  if( str == "minus" ) {
    sp->strand = DNA::Strand::Minus;
  } else if( str == "both" ) {
    sp->strand = DNA::Strand::Both;
  }
}